

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,ArenaAllocator *allocator,
          Page *element)

{
  code *pcVar1;
  bool bVar2;
  DListNode<Memory::CustomHeap::Page> *pDVar3;
  undefined4 *puVar4;
  char **buffer;
  
  buffer = &element[-1].address;
  pDVar3 = (DListNode<Memory::CustomHeap::Page> *)this;
  do {
    pDVar3 = (pDVar3->super_DListNodeBase<Memory::CustomHeap::Page>).next.node;
    if (pDVar3 == (DListNode<Memory::CustomHeap::Page> *)this) break;
  } while (pDVar3 != (DListNode<Memory::CustomHeap::Page> *)buffer);
  if (pDVar3 == (DListNode<Memory::CustomHeap::Page> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  **(undefined8 **)&element[-1].currentBucket = *buffer;
  *(undefined8 *)(*buffer + 8) = *(undefined8 *)&element[-1].currentBucket;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x38);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }